

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void setDWPTEntropy(wpt_object wt,char *entropy,double eparam)

{
  int iVar1;
  
  iVar1 = strcmp(entropy,"shannon");
  if (iVar1 == 0) {
    builtin_strncpy(wt->entropy,"shannon",8);
  }
  else {
    iVar1 = strcmp(entropy,"threshold");
    if (iVar1 == 0) {
      builtin_strncpy(wt->entropy,"threshold",10);
    }
    else {
      iVar1 = strcmp(entropy,"norm");
      if (iVar1 != 0) {
        iVar1 = strcmp(entropy,"logenergy");
        if (((iVar1 != 0) && (iVar1 = strcmp(entropy,"log energy"), iVar1 != 0)) &&
           (iVar1 = strcmp(entropy,"energy"), iVar1 != 0)) {
          printf("Entropy should be one of shannon, threshold, norm or logenergy");
          exit(-1);
        }
        builtin_strncpy(wt->entropy,"logenergy",10);
        return;
      }
      builtin_strncpy(wt->entropy,"norm",5);
    }
    wt->eparam = eparam;
  }
  return;
}

Assistant:

void setDWPTEntropy(wpt_object wt, const char *entropy, double eparam) {
	if (!strcmp(entropy, "shannon")) {
		strcpy(wt->entropy, "shannon");
	}
	else if (!strcmp(entropy, "threshold")) {
		strcpy(wt->entropy, "threshold");
		wt ->eparam = eparam;
	}
	else if (!strcmp(entropy, "norm")) {
		strcpy(wt->entropy, "norm");
		wt->eparam = eparam;
	}
	else if (!strcmp(entropy, "logenergy") || !strcmp(entropy, "log energy") || !strcmp(entropy, "energy")) {
		strcpy(wt->entropy, "logenergy");
	}
	else {
		printf("Entropy should be one of shannon, threshold, norm or logenergy");
		exit(-1);
	}
}